

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O2

void __thiscall WSNTopologyBasedEnergy::DrawWSNLayer(WSNTopologyBasedEnergy *this)

{
  allocator<char> local_89;
  Matx<double,_4,_1> local_88;
  _InputArray local_60;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x3010000;
  local_28 = 0;
  local_60.obj = this;
  cv::Matx<double,_4,_1>::Matx(&local_88);
  local_88.val[0] = 255.0;
  local_88.val[1] = 0.0;
  local_88.val[2] = 255.0;
  local_88.val[3] = 0.0;
  cv::circle(&local_60,&local_28,1,&local_88,1,8,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"WSN",&local_89);
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x1010000;
  local_60.obj = this;
  cv::imshow((string *)&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  if (this->Test == true) {
    cv::waitKey(200);
  }
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x3010000;
  local_30 = 0;
  local_60.obj = this;
  cv::Matx<double,_4,_1>::Matx(&local_88);
  local_88.val[0] = 255.0;
  local_88.val[1] = 0.0;
  local_88.val[2] = 255.0;
  local_88.val[3] = 0.0;
  cv::circle(&local_60,&local_30,0x12f,&local_88,1,8,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"WSN",&local_89);
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x1010000;
  local_60.obj = this;
  cv::imshow((string *)&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  if (this->Test == true) {
    cv::waitKey(200);
  }
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x3010000;
  local_38 = 0;
  local_60.obj = this;
  cv::Matx<double,_4,_1>::Matx(&local_88);
  local_88.val[0] = 255.0;
  local_88.val[1] = 0.0;
  local_88.val[2] = 255.0;
  local_88.val[3] = 0.0;
  cv::circle(&local_60,&local_38,0x1ac,&local_88,1,8,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"WSN",&local_89);
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x1010000;
  local_60.obj = this;
  cv::imshow((string *)&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  if (this->Test == true) {
    cv::waitKey(200);
  }
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x3010000;
  local_40 = 0;
  local_60.obj = this;
  cv::Matx<double,_4,_1>::Matx(&local_88);
  local_88.val[0] = 255.0;
  local_88.val[1] = 0.0;
  local_88.val[2] = 255.0;
  local_88.val[3] = 0.0;
  cv::circle(&local_60,&local_40,0x20c,&local_88,1,8,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"WSN",&local_89);
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x1010000;
  local_60.obj = this;
  cv::imshow((string *)&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  if (this->Test == true) {
    cv::waitKey(200);
  }
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x3010000;
  local_48 = 0;
  local_60.obj = this;
  cv::Matx<double,_4,_1>::Matx(&local_88);
  local_88.val[0] = 255.0;
  local_88.val[1] = 0.0;
  local_88.val[2] = 255.0;
  local_88.val[3] = 0.0;
  cv::circle(&local_60,&local_48,0x260,&local_88,1,8,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"WSN",&local_89);
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x1010000;
  local_60.obj = this;
  cv::imshow((string *)&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  if (this->Test == true) {
    cv::waitKey(0);
  }
  return;
}

Assistant:

void WSNTopologyBasedEnergy::DrawWSNLayer()
{
	circle(img,Point(0,0),1,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey(200);

	circle(img,Point(0,0),303,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey(200);

	circle(img,Point(0,0),428,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey(200);

	circle(img,Point(0,0),524,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey(200);

	circle(img,Point(0,0),608,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey();
}